

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O1

void cppcms::http::response::make_error_response_html_body(int stat,ostream *out,string *msg)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,
             "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n\t\"http://www.w3.org/TR/html4/loose.dtd\">\n<html>\n  <head>\n    <title>"
             ,0x83);
  poVar1 = (ostream *)std::ostream::operator<<(out,stat);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," &mdash; ",9);
  __s = status_to_string(stat);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"</title>\n  </head>\n  <body>\n    <h1>",0x24);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,stat);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," &mdash; ",9);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</h1>\n",6);
  if (msg->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"    <p>",7);
    util::escape(&local_50,msg);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</p>\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"  </body>\n</html>\n",0x12);
  return;
}

Assistant:

void response::make_error_response_html_body(int stat,std::ostream &out,std::string const &msg)
{
	out   <<"<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
		"	\"http://www.w3.org/TR/html4/loose.dtd\">\n"
		"<html>\n"
		"  <head>\n"
		"    <title>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</title>\n"
		"  </head>\n"
		"  <body>\n"
		"    <h1>"<<stat<<" &mdash; "<< http::response::status_to_string(stat)<<"</h1>\n";
	if(!msg.empty()) {
		out<<"    <p>"<<util::escape(msg)<<"</p>\n";
	}
	out  <<	"  </body>\n"
		"</html>\n";

}